

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,NumericForStatement *num_for,void *data)

{
  SyntaxTree *pSVar1;
  Guard g;
  ExpVarData exp_var_data;
  Guard l;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  undefined8 local_5c;
  undefined1 local_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  Guard local_30;
  
  local_a0._8_8_ = this->current_function_->current_loop_;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_manager;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  local_80._M_unused._M_object = this;
  local_80._8_8_ = num_for;
  Guard::Guard(&local_30,(function<void_()> *)&local_80,(function<void_()> *)&local_a0);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  local_5c = 1;
  local_54 = 0;
  pSVar1 = (num_for->exp1_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  pSVar1 = (num_for->exp2_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_5c);
  pSVar1 = (num_for->exp3_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_5c);
  }
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  local_50._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_80,(function<void_()> *)&local_a0,(function<void_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  InsertName(this,(num_for->name_).field_0.str_);
  pSVar1 = (num_for->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  Guard::~Guard((Guard *)&local_80);
  Guard::~Guard(&local_30);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(NumericForStatement *num_for, void *data)
    {
        SEMANTIC_ANALYSIS_LOOP_GUARD(num_for);
        ExpVarData exp_var_data{ SemanticOp_Read };
        num_for->exp1_->Accept(this, &exp_var_data);
        num_for->exp2_->Accept(this, &exp_var_data);
        if (num_for->exp3_)
            num_for->exp3_->Accept(this, &exp_var_data);

        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
        InsertName(num_for->name_.str_);
        num_for->block_->Accept(this, nullptr);
    }